

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

void __thiscall
c4::yml::NodeScalar::set_ref_maybe_replacing_scalar(NodeScalar *this,csubstr ref,bool has_scalar)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  basic_substring<const_char> local_30;
  
  uVar4 = ref.len;
  pcVar5 = ref.str;
  pcVar2 = pcVar5;
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = uVar4;
    if (*pcVar5 == '*') {
      basic_substring<const_char>::basic_substring(&local_30,pcVar5 + 1,uVar4 - 1);
      pcVar2 = local_30.str;
      uVar3 = local_30.len;
    }
  }
  (this->anchor).str = pcVar2;
  (this->anchor).len = uVar3;
  if ((has_scalar) && (uVar1 = (this->scalar).len, uVar3 <= uVar1)) {
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        if ((this->scalar).str[uVar6 + (uVar1 - uVar3)] != pcVar2[uVar6]) goto LAB_001ed1ed;
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  else {
LAB_001ed1ed:
    (this->scalar).str = pcVar5;
    (this->scalar).len = uVar4;
  }
  return;
}

Assistant:

void set_ref_maybe_replacing_scalar(csubstr ref, bool has_scalar) noexcept
    {
        csubstr trimmed = ref.begins_with('*') ? ref.sub(1) : ref;
        anchor = trimmed;
        if((!has_scalar) || !scalar.ends_with(trimmed))
            scalar = ref;
    }